

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
* __thiscall
testing::internal::
DoAllAction<testing::internal::WithArgsAction<InterpreterTestSuite_CMNO_UnsuccessfullResultFromAJobMustNotFail_Test::TestBody()::$_0,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
::
Convert<testing::Action<void(std::shared_ptr<ot::commissioner::CommissionerApp>&,ot::commissioner::Config_const&)>,0ul>
          (void *__return_storage_ptr__,
          tuple<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:819:30),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
          *this)

{
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  WithArgsAction *this_00;
  _Any_data *local_90;
  allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  local_65 [13];
  _Any_data *local_58;
  _Any_data local_50 [2];
  _Any_data local_30;
  tuple<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:819:30),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  *local_20;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:819:30),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  *this_local;
  void *local_10;
  
  local_58 = local_50;
  local_20 = this;
  local_10 = __return_storage_ptr__;
  this_00 = (WithArgsAction *)
            std::
            get<0ul,testing::internal::WithArgsAction<InterpreterTestSuite_CMNO_UnsuccessfullResultFromAJobMustNotFail_Test::TestBody()::__0,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                      (this);
  WithArgsAction::operator_cast_to_Action
            ((Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              *)local_50,this_00);
  local_30._M_unused._M_object = local_50;
  local_30._8_8_ = 1;
  std::
  allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  ::allocator(local_65);
  __l._M_len = local_30._8_8_;
  __l._M_array = (iterator)local_30._M_unused._0_8_;
  std::
  vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
  ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
            *)__return_storage_ptr__,__l,local_65);
  std::
  allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  ::~allocator(local_65);
  local_90 = &local_30;
  do {
    local_90 = local_90 + -2;
    Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
    ::~Action((Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
               *)local_90);
  } while (local_90 != local_50);
  return (vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
          *)__return_storage_ptr__;
}

Assistant:

std::vector<ActionT> Convert(IndexSequence<I...>) const {
    return {ActionT(std::get<I>(actions))...};
  }